

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
TextReaderTest_InvalidNumOptions_Test::TestBody(TextReaderTest_InvalidNumOptions_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  ReadError *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_3;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff948;
  BasicStringRef<char> *in_stack_fffffffffffff950;
  int *in_stack_fffffffffffff958;
  char *in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  char *in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff978;
  Type in_stack_fffffffffffff97c;
  undefined7 in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff987;
  char *in_stack_fffffffffffff988;
  CStringRef arg0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Message *in_stack_fffffffffffff9c8;
  undefined7 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d7;
  int in_stack_fffffffffffffad4;
  StringRef in_stack_fffffffffffffad8;
  BasicCStringRef<char> local_498;
  string local_490 [54];
  byte local_45a;
  allocator<char> local_459;
  string local_458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  int local_404;
  byte local_2da;
  allocator<char> local_2d9;
  string local_2d8 [32];
  AssertionResult local_2b8 [20];
  undefined4 local_174;
  AssertionResult local_170 [21];
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  fmt::BasicStringRef<char>::BasicStringRef
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948);
  ReadHeader(in_stack_fffffffffffffad4,in_stack_fffffffffffffad8);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,in_stack_fffffffffffff958,(int *)in_stack_fffffffffffff950,
             in_stack_fffffffffffff948);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    testing::AssertionResult::failure_message((AssertionResult *)0x140b5e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
               in_stack_fffffffffffff97c,in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
               in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
               in_stack_fffffffffffff9c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x140bc1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x140c19);
  local_174 = 0;
  fmt::BasicStringRef<char>::BasicStringRef
            (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948);
  ReadHeader(in_stack_fffffffffffffad4,in_stack_fffffffffffffad8);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,in_stack_fffffffffffff958,(int *)in_stack_fffffffffffff950,
             in_stack_fffffffffffff948);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    testing::AssertionResult::failure_message((AssertionResult *)0x140d0a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
               in_stack_fffffffffffff97c,in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
               in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
               in_stack_fffffffffffff9c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x140d6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x140dc5);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    std::allocator<char>::~allocator(&local_2d9);
    local_2da = 0;
    in_stack_fffffffffffff9d7 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff9d7) {
      fmt::BasicStringRef<char>::BasicStringRef
                (in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948);
      ReadHeader(in_stack_fffffffffffffad4,in_stack_fffffffffffffad8);
    }
    if ((local_2da & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                 (char (*) [99])CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      local_404 = 2;
    }
    else {
      local_404 = 0;
    }
    std::__cxx11::string::~string(local_2d8);
    if (local_404 != 0) goto LAB_00141154;
  }
  else {
LAB_00141154:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    testing::AssertionResult::failure_message((AssertionResult *)0x141170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
               in_stack_fffffffffffff97c,in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
               in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
               in_stack_fffffffffffff9c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x1411cd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x141225);
  this_01 = &local_438;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)this_01);
  if (bVar1) {
    arg0.data_ = (char *)&local_459;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,arg0.data_,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
    std::allocator<char>::~allocator(&local_459);
    local_45a = 0;
    in_stack_fffffffffffff987 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff987) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_498,"g{}");
      fmt::format<unsigned_int>
                (arg0,(uint *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
      fmt::BasicStringRef<char>::BasicStringRef(in_stack_fffffffffffff950,in_stack_fffffffffffff948)
      ;
      ReadHeader(in_stack_fffffffffffffad4,in_stack_fffffffffffffad8);
      std::__cxx11::string::~string(local_490);
    }
    if ((local_45a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                 (char (*) [151])CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      local_404 = 3;
    }
    else {
      local_404 = 0;
    }
    std::__cxx11::string::~string(local_458);
    if (local_404 == 0) goto LAB_001416c2;
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980));
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x14161d);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
             in_stack_fffffffffffff97c,in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
             in_stack_fffffffffffff960);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
             in_stack_fffffffffffff9c8);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x14167a);
LAB_001416c2:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1416cf);
  return;
}

Assistant:

TEST(TextReaderTest, InvalidNumOptions) {
  EXPECT_EQ(0, ReadHeader(0, "ga").num_ampl_options);
  EXPECT_EQ(0, ReadHeader(0, "g-1").num_ampl_options);
  EXPECT_THROW_MSG(ReadHeader(0, "g10"),
      ReadError, "(input):1:2: too many options");
  EXPECT_THROW_MSG(ReadHeader(0,
      fmt::format("g{}", static_cast<unsigned>(INT_MAX) + 1)),
      ReadError, "(input):1:2: number is too big");
}